

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall Engine_testIncrWithTags_Test::TestBody(Engine_testIncrWithTags_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  pointer pHVar2;
  char *pcVar3;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  value_type im;
  AssertionResult gtest_ar;
  TestHandler *th;
  value_type *h;
  Engine e;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  undefined1 uVar4;
  Measure<int> *in_stack_fffffffffffffc68;
  int line;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  undefined1 uVar5;
  undefined8 in_stack_fffffffffffffc78;
  Type type;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  undefined1 uVar6;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  char *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  Message *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined1 uVar7;
  long local_318;
  AssertionResult local_2d8 [2];
  AssertionResult local_2b8 [2];
  AssertionResult local_298 [2];
  Tag *in_stack_fffffffffffffd88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  Engine *in_stack_fffffffffffffda0;
  AssertionResult local_248 [2];
  undefined4 local_224;
  AssertionResult local_220 [2];
  undefined4 local_1fc;
  AssertionResult local_1f8 [2];
  undefined4 local_1d4;
  AssertionResult local_1d0 [2];
  AssertionResult local_1b0 [4];
  vector<Tag,_std::allocator<Tag>_> local_168;
  uint local_14c;
  size_type local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  long local_118;
  const_reference local_110;
  allocator local_81;
  string local_80 [64];
  Engine local_40;
  
  type = (Type)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  std::make_unique<TestHandler>();
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),in_stack_fffffffffffffc58
            );
  Engine::Engine((Engine *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc98,
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"foo",&local_81);
  Tag::Tag((Tag *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
           in_stack_fffffffffffffc98,
           (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  Tag::Tag((Tag *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
           in_stack_fffffffffffffc98,
           (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  Engine::Incr<Tag,Tag>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (Tag *)in_stack_fffffffffffffd90.ptr_,in_stack_fffffffffffffd88);
  Tag::~Tag((Tag *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  Tag::~Tag((Tag *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  this_00 = Engine::GetHandlers(&local_40);
  local_110 = std::
              vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              ::operator[](this_00,0);
  pHVar2 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                     ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                      CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  if (pHVar2 == (pointer)0x0) {
    local_318 = 0;
  }
  else {
    local_318 = __dynamic_cast(pHVar2,&Handler::typeinfo,&TestHandler::typeinfo,0);
  }
  local_118 = local_318;
  local_12c = 1;
  local_138 = std::vector<Measure<int>,_std::allocator<Measure<int>_>_>::size
                        ((vector<Measure<int>,_std::allocator<Measure<int>_>_> *)(local_318 + 8));
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffffc68,
             (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
             (int *)in_stack_fffffffffffffc58,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    testing::AssertionResult::failure_message((AssertionResult *)0x1182e1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),type,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    testing::Message::~Message((Message *)0x118344);
  }
  local_14c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1183b2);
  if (local_14c == 0) {
    std::vector<Measure<int>,_std::allocator<Measure<int>_>_>::operator[]
              ((vector<Measure<int>,_std::allocator<Measure<int>_>_> *)(local_118 + 8),0);
    Measure<int>::Measure
              ((Measure<int> *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68);
    testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffc68,
               (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
               (char (*) [9])in_stack_fffffffffffffc58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b0);
    uVar7 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      in_stack_fffffffffffffcc8 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x11849e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),type,
                 (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                 (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      testing::Message::~Message((Message *)0x118501);
    }
    local_14c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11856f);
    if (local_14c == 0) {
      local_1d4 = 0;
      testing::internal::EqHelper<false>::Compare<MetricTypes::MetricType,MetricTypes::MetricType>
                ((char *)in_stack_fffffffffffffc68,
                 (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                 (MetricType *)in_stack_fffffffffffffc58,
                 (MetricType *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
        testing::AssertionResult::failure_message((AssertionResult *)0x118621);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                   type,(char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                   in_stack_fffffffffffffcc8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        testing::Message::~Message((Message *)0x11867e);
      }
      local_14c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1186ec);
      if (local_14c == 0) {
        local_1fc = 1;
        testing::internal::EqHelper<false>::Compare<int,float>
                  ((char *)in_stack_fffffffffffffc68,
                   (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                   (int *)in_stack_fffffffffffffc58,
                   (float *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          testing::AssertionResult::failure_message((AssertionResult *)0x11879e);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                     type,(char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                     (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          testing::Message::~Message((Message *)0x1187fb);
        }
        local_14c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x118869);
        if (local_14c == 0) {
          local_224 = 1;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((char *)in_stack_fffffffffffffc68,
                     (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                     (int *)in_stack_fffffffffffffc58,
                     (int *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
          if (!bVar1) {
            testing::Message::Message
                      ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            testing::AssertionResult::failure_message((AssertionResult *)0x11891b);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80)
                       ,type,(char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                       (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                       in_stack_fffffffffffffcc8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50)
                      );
            testing::Message::~Message((Message *)0x118978);
          }
          local_14c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1189e6);
          if (local_14c == 0) {
            std::vector<Tag,_std::allocator<Tag>_>::size(&local_168);
            testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                      ((char *)in_stack_fffffffffffffc68,
                       (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                       (int *)in_stack_fffffffffffffc58,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
            if (!bVar1) {
              testing::Message::Message
                        ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
              testing::AssertionResult::failure_message((AssertionResult *)0x118aad);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),type,
                         (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                         (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                         in_stack_fffffffffffffcc8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
              testing::Message::~Message((Message *)0x118b0a);
            }
            local_14c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x118b78);
            if (local_14c == 0) {
              std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_168,0);
              testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                        ((char *)in_stack_fffffffffffffc68,
                         (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                         (char (*) [6])in_stack_fffffffffffffc58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffd88);
              uVar6 = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffc80));
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x118c2a);
                type = (Type)((ulong)pcVar3 >> 0x20);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc80),type,
                           (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                           (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                           (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                           in_stack_fffffffffffffcc8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                testing::Message::~Message((Message *)0x118c87);
              }
              local_14c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x118cf5);
              if (local_14c == 0) {
                std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_168,0);
                testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                          ((char *)in_stack_fffffffffffffc68,
                           (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                           (char (*) [6])in_stack_fffffffffffffc58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
                uVar5 = bVar1;
                if (!bVar1) {
                  testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffc80));
                  in_stack_fffffffffffffc68 =
                       (Measure<int> *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x118dab);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc80),type,
                             (char *)CONCAT17(uVar5,in_stack_fffffffffffffc70),
                             (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                             in_stack_fffffffffffffcc8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                  testing::Message::~Message((Message *)0x118e08);
                }
                local_14c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x118e76);
                if (local_14c == 0) {
                  std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_168,1);
                  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
                            ((char *)in_stack_fffffffffffffc68,
                             (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                             (char (*) [8])in_stack_fffffffffffffc58,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
                  uVar4 = bVar1;
                  if (!bVar1) {
                    testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffc80));
                    in_stack_fffffffffffffc58 =
                         (unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
                         testing::AssertionResult::failure_message((AssertionResult *)0x118f29);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc80),type,
                               (char *)CONCAT17(uVar5,in_stack_fffffffffffffc70),
                               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                               (char *)CONCAT17(uVar4,in_stack_fffffffffffffc60));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                               in_stack_fffffffffffffcc8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)
                               CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                    testing::Message::~Message((Message *)0x118f86);
                  }
                  local_14c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x118ff4);
                  if (local_14c == 0) {
                    std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_168,1);
                    testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                              ((char *)in_stack_fffffffffffffc68,
                               (char *)CONCAT17(uVar4,in_stack_fffffffffffffc60),
                               (char (*) [4])in_stack_fffffffffffffc58,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                    line = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
                    in_stack_fffffffffffffc57 = bVar1;
                    if (!bVar1) {
                      testing::Message::Message
                                ((Message *)CONCAT17(uVar6,in_stack_fffffffffffffc80));
                      testing::AssertionResult::failure_message((AssertionResult *)0x1190ab);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc80),type,
                                 (char *)CONCAT17(uVar5,in_stack_fffffffffffffc70),line,
                                 (char *)CONCAT17(uVar4,in_stack_fffffffffffffc60));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                                 in_stack_fffffffffffffcc8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)
                                 CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                      testing::Message::~Message((Message *)0x119106);
                    }
                    local_14c = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x119171);
                    if (local_14c == 0) {
                      local_14c = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Measure<int>::~Measure
              ((Measure<int> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  }
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  return;
}

Assistant:

TEST(Engine, testIncrWithTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Incr("foo", Tag("Hello", "World"), Tag("Another", "Tag"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(1, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Hello", im.tags[0].name);
    ASSERT_EQ("World", im.tags[0].value);
    ASSERT_EQ("Another", im.tags[1].name);
    ASSERT_EQ("Tag", im.tags[1].value);
}